

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

int __thiscall Console::init(Console *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ROM *pRVar2;
  PPU *this_00;
  PPU *_apu;
  CPU *this_01;
  Memory *pMVar3;
  Controller *this_02;
  EVP_PKEY_CTX *ctx_00;
  string *this_03;
  APU *in_stack_ffffffffffffff80;
  string local_40 [48];
  EVP_PKEY_CTX *local_10;
  Console *local_8;
  
  this->prev_frame = 0;
  local_10 = ctx;
  local_8 = this;
  pRVar2 = (ROM *)operator_new(0x2030);
  ROM::ROM((ROM *)0x117199);
  this->rom = pRVar2;
  this_00 = (PPU *)operator_new(1);
  APU::APU(in_stack_ffffffffffffff80);
  this->apu = (APU *)this_00;
  _apu = (PPU *)operator_new(0xac8);
  ctx_00 = (EVP_PKEY_CTX *)this->apu;
  PPU::PPU(this_00,(APU *)_apu);
  this->ppu = _apu;
  this_01 = (CPU *)operator_new(0x30);
  CPU::CPU(this_01);
  this->cpu = this_01;
  pMVar3 = (Memory *)operator_new(0x830);
  Memory::Memory((Memory *)0x11724a);
  this->mem = pMVar3;
  this_02 = (Controller *)operator_new(10);
  Controller::Controller(this_02);
  this->controller = this_02;
  APU::init(this->apu,ctx_00);
  pRVar2 = this->rom;
  this_03 = local_40;
  std::__cxx11::string::string(this_03,(string *)ctx);
  ROM::init(pRVar2,(EVP_PKEY_CTX *)this_03);
  std::__cxx11::string::~string(local_40);
  Memory::init(this->mem,(EVP_PKEY_CTX *)this_03);
  CPU::init(this->cpu,(EVP_PKEY_CTX *)this_03);
  iVar1 = PPU::init(this->ppu,(EVP_PKEY_CTX *)this_03);
  return iVar1;
}

Assistant:

void Console::init(std::string filename) {
    prev_frame = 0;
    rom = new ROM();
    apu = new APU();
    ppu = new PPU(apu);
    cpu = new CPU();
    mem = new Memory();
    controller = new Controller();
    apu->init();
    rom->init(std::move(filename));
    mem->init();
    cpu->init();
    ppu->init();
}